

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void R_SetupFrame(AActor *actor)

{
  double *pdVar1;
  extsector_t *peVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  InterpolationViewer *iview;
  subsector_t *psVar7;
  sector_t *psVar8;
  TObjPtr<AActor> TVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  AActor *pAVar13;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *player;
  ulong uVar14;
  secplane_t *this;
  undefined4 uVar15;
  undefined4 uVar16;
  player_t *ppVar17;
  double dVar18;
  bool unlinked;
  double local_e0;
  player_t *local_d8;
  double dStack_d0;
  DAngle an;
  DAngle camangle;
  DVector3 campos;
  
  if (actor == (AActor *)0x0) {
    I_Error("Tried to render from a NULL actor.");
  }
  player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)actor->player;
  unlinked = false;
  TVar9.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)actor;
  if (((player != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) &&
      (TVar9.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)actor,
      *(AActor **)player == actor)) &&
     (TVar9.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
           GC::ReadBarrier<AActor>((AActor **)(player + 0x2f)),
     TVar9.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0)) {
    camera = *(AActor **)player;
    player[0x2f] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)camera;
    TVar9.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)camera;
    if (camera == (AActor *)0x0) {
      I_Error("You lost your body. Bad dehacked work is likely to blame.");
      TVar9.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)camera;
    }
  }
  camera = (AActor *)TVar9.field_0;
  iview = FindPastViewer(camera);
  iVar4 = (*I_GetTime)(false);
  if (iview->otic < iVar4 && iview->otic != -1) {
    iview->otic = iVar4;
    InterpolationViewer::instance::operator=(&iview->Old,&iview->New);
  }
  if (((player == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) ||
      (gamestate == GS_TITLELEVEL)) ||
     (((*(int *)(player + 0x1d) & 0x20) == 0 &&
      ((r_deathcamera.Value != true || (0 < camera->health)))))) {
    ppVar17 = (player_t *)(camera->__Pos).X;
    dVar18 = (camera->__Pos).Y;
    if (camera->player == (player_t *)0x0) {
      local_e0 = (camera->__Pos).Z;
      local_d8 = ppVar17;
      dStack_d0 = dVar18;
      dVar3 = AActor::GetCameraHeight(camera);
      dVar3 = dVar3 + local_e0;
      ppVar17 = local_d8;
      dVar18 = dStack_d0;
    }
    else {
      dVar3 = camera->player->viewz;
    }
    pAVar13 = camera;
    (iview->New).Pos.Z = dVar3;
    (iview->New).Pos.X = (double)ppVar17;
    (iview->New).Pos.Y = dVar18;
    viewsector = pAVar13->Sector;
    r_showviewer = false;
  }
  else {
    campos.X = (iview->Old).Pos.X;
    campos.Y = (iview->Old).Pos.Y;
    local_d8 = (player_t *)player;
    psVar7 = R_PointInSubsector((DVector2 *)&campos);
    psVar8 = psVar7->sector;
    P_AimCamera(camera,&campos,&camangle,&viewsector,&unlinked);
    (iview->New).Pos.Z = campos.Z;
    (iview->New).Pos.X = campos.X;
    (iview->New).Pos.Y = campos.Y;
    (iview->New).Angles.Yaw.Degrees = camangle.Degrees;
    r_showviewer = true;
    if ((viewsector->PortalGroup != psVar8->PortalGroup) ||
       ((pAVar13 = camera, player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)local_d8,
        unlinked == true &&
        (dVar18 = campos.X - (iview->Old).Pos.X, dVar3 = campos.Y - (iview->Old).Pos.Y,
        65536.0 < dVar3 * dVar3 + dVar18 * dVar18)))) {
      iview->otic = iVar4;
      InterpolationViewer::instance::operator=(&iview->Old,&iview->New);
      r_NoInterpolate = true;
      pAVar13 = camera;
      player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)local_d8;
    }
  }
  (iview->New).Angles.Roll.Degrees = (pAVar13->Angles).Roll.Degrees;
  (iview->New).Angles.Yaw.Degrees = (pAVar13->Angles).Yaw.Degrees;
  (iview->New).Angles.Pitch.Degrees = (pAVar13->Angles).Pitch.Degrees;
  if (pAVar13->player != (player_t *)0x0) {
    player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)pAVar13->player;
  }
  if ((iview->otic == -1) || (r_NoInterpolate == true)) {
    R_ResetViewInterpolation();
    iview->otic = iVar4;
  }
  r_TicFracF = I_GetTimeFrac(&r_FrameTime);
  uVar15 = SUB84(r_TicFracF,0);
  uVar16 = (undefined4)((ulong)r_TicFracF >> 0x20);
  if ((cl_capfps.Value != false) || (r_NoInterpolate == true)) {
    r_TicFracF = 1.0;
    uVar15 = 0;
    uVar16 = 0x3ff00000;
  }
  R_InterpolateView((player_t *)player,(double)CONCAT44(uVar16,uVar15),iview);
  R_SetViewAngle();
  FInterpolator::DoInterpolations(&interpolator,r_TicFracF);
  if ((viewsector->planes[1].Flags & 0x1d0U) != 0x100) {
    campos.X = ViewPos.X;
    campos.Y = ViewPos.Y;
    dVar18 = secplane_t::ZatPoint(&viewsector->ceilingplane,(DVector2 *)&campos);
    if (dVar18 + -4.0 < ViewPos.Z) {
      ViewPos.Z = dVar18 + -4.0;
    }
  }
  if ((viewsector->planes[0].Flags & 0x1d0U) != 0x100) {
    campos.X = ViewPos.X;
    campos.Y = ViewPos.Y;
    dVar18 = secplane_t::ZatPoint(&viewsector->floorplane,(DVector2 *)&campos);
    if (ViewPos.Z < dVar18 + 4.0) {
      ViewPos.Z = dVar18 + 4.0;
    }
  }
  if (paused == 0) {
    campos.Z = 0.0;
    campos.X = 0.0;
    campos.Y = 0.0;
    iVar4 = DEarthquake::StaticGetQuakeIntensities(camera,(FQuakeJiggers *)&campos);
    if (0 < iVar4) {
      local_e0 = (double)r_quakeintensity.Value;
      if ((campos.X != 0.0) || (NAN(campos.X))) {
        dVar18 = QuakePower(local_e0,campos.X,0.0);
        ViewPos.X = dVar18 + ViewPos.X;
      }
      if ((campos.Y != 0.0) || (NAN(campos.Y))) {
        dVar18 = QuakePower(local_e0,campos.Y,0.0);
        ViewPos.Y = dVar18 + ViewPos.Y;
      }
      if ((campos.Z != 0.0) || (NAN(campos.Z))) {
        dVar18 = QuakePower(local_e0,campos.Z,0.0);
        ViewPos.Z = dVar18 + ViewPos.Z;
      }
    }
  }
  if (camera->player == (player_t *)0x0) {
    extralight = 0;
  }
  else {
    extralight = camera->player->extralight;
  }
  peVar2 = viewsector->e;
  uVar6 = (peVar2->XFloor).lightlist.Count;
  local_d8 = (player_t *)player;
  if (uVar6 == 0) {
    psVar8 = sector_t::GetHeightSec(viewsector);
    if (psVar8 == (sector_t *)0x0) {
      uVar14 = 0;
    }
    else {
      iVar4 = secplane_t::PointOnSide(&psVar8->floorplane,&ViewPos);
      if (iVar4 < 0) {
        lVar12 = 0x1a8;
      }
      else {
        uVar6 = secplane_t::PointOnSide(&psVar8->ceilingplane,&ViewPos);
        lVar12 = (ulong)(uVar6 >> 0x1f) * 4 + 0x1ac;
      }
      uVar6 = *(uint *)((long)&psVar8->planes[0].xform.xOffs + lVar12);
      uVar14 = (ulong)uVar6;
      if (uVar14 < 0x1000000) {
        uVar10 = 0;
        if (uVar14 < numfakecmaps) {
          uVar10 = uVar6;
        }
        uVar14 = (ulong)uVar10;
      }
    }
  }
  else {
    lVar12 = 0x50;
    uVar14 = 0;
    for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 1) {
      if (uVar11 < uVar6 - 1) {
        this = (secplane_t *)((long)&(((peVar2->XFloor).lightlist.Array)->plane).normal.X + lVar12);
      }
      else {
        this = &viewsector->floorplane;
      }
      iVar5 = secplane_t::PointOnSide(this,&ViewPos);
      pdVar1 = &(this->normal).Z;
      iVar4 = -iVar5;
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        iVar4 = iVar5;
      }
      if (0 < iVar4) {
        uVar6 = *(uint *)((long)(peVar2->XFloor).lightlist.Array + lVar12 + -0x18);
        uVar10 = (uint)(uVar6 != 0) << 0x1f;
        if (0xffffff < uVar6) {
          uVar10 = uVar6 & 0xff000000;
        }
        uVar14 = (ulong)(uVar6 & 0xffffff | uVar10);
        break;
      }
      uVar6 = (peVar2->XFloor).lightlist.Count;
      lVar12 = lVar12 + 0x50;
    }
  }
  uVar6 = (uint)uVar14;
  if (R_OldBlend != uVar6) {
    R_OldBlend = uVar6;
    if (uVar6 < 0x1000000) {
      NormalLight.Maps = realcolormaps + (uVar6 << 0xd);
      BaseBlendB = 0;
      BaseBlendG = 0;
      BaseBlendR = 0;
      BaseBlendA = 0.0;
    }
    else {
      BaseBlendR = (uint)(uVar14 >> 0x10) & 0xff;
      BaseBlendG = (uint)(uVar14 >> 8) & 0xff;
      BaseBlendB = uVar6 & 0xff;
      BaseBlendA = (float)(int)(uVar14 >> 0x18) / 255.0;
      NormalLight.Maps = realcolormaps;
    }
  }
  (*Renderer->_vptr_FRenderer[0x12])();
  (*Renderer->_vptr_FRenderer[0x11])(Renderer,local_d8);
  validcount = validcount + 1;
  if (((DFrameBuffer *)RenderTarget == screen) && (r_clearbuffer.Value != 0)) {
    iVar4 = r_clearbuffer.Value;
    if (r_clearbuffer.Value == 3) {
      uVar6 = I_FPSTime();
      iVar4 = ((uVar6 >> 7 & 1) != 0) + 1;
    }
    if (iVar4 == 4) {
      uVar6 = I_FPSTime();
      uVar14 = (ulong)(uVar6 >> 5 & 0xff);
    }
    else if (iVar4 == 2) {
      uVar14 = (ulong)GPalette.WhiteIndex;
    }
    else if (iVar4 == 1) {
      uVar14 = (ulong)GPalette.BlackIndex;
    }
    else {
      uVar6 = FRandom::operator()(&pr_hom);
      uVar14 = (ulong)uVar6;
    }
    (*Renderer->_vptr_FRenderer[0xe])(Renderer,uVar14);
  }
  return;
}

Assistant:

void R_SetupFrame (AActor *actor)
{
	if (actor == NULL)
	{
		I_Error ("Tried to render from a NULL actor.");
	}

	player_t *player = actor->player;
	unsigned int newblend;
	InterpolationViewer *iview;
	bool unlinked = false;

	if (player != NULL && player->mo == actor)
	{	// [RH] Use camera instead of viewplayer
		camera = player->camera;
		if (camera == NULL)
		{
			camera = player->camera = player->mo;
		}
	}
	else
	{
		camera = actor;
	}

	if (camera == NULL)
	{
		I_Error ("You lost your body. Bad dehacked work is likely to blame.");
	}

	iview = FindPastViewer (camera);

	int nowtic = I_GetTime (false);
	if (iview->otic != -1 && nowtic > iview->otic)
	{
		iview->otic = nowtic;
		iview->Old = iview->New;
	}

	if (player != NULL && gamestate != GS_TITLELEVEL &&
		((player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)))
	{
		sector_t *oldsector = R_PointInSubsector(iview->Old.Pos)->sector;
		// [RH] Use chasecam view
		DVector3 campos;
		DAngle camangle;
		P_AimCamera (camera, campos, camangle, viewsector, unlinked);	// fixme: This needs to translate the angle, too.
		iview->New.Pos = campos;
		iview->New.Angles.Yaw = camangle;
		
		r_showviewer = true;
		// Interpolating this is a very complicated thing because nothing keeps track of the aim camera's movement, so whenever we detect a portal transition
		// it's probably best to just reset the interpolation for this move.
		// Note that this can still cause problems with unusually linked portals
		if (viewsector->PortalGroup != oldsector->PortalGroup || (unlinked && ((iview->New.Pos.XY() - iview->Old.Pos.XY()).LengthSquared()) > 256*256))
		{
			iview->otic = nowtic;
			iview->Old = iview->New;
			r_NoInterpolate = true;
		}
	}
	else
	{
		iview->New.Pos = { camera->Pos().XY(), camera->player ? camera->player->viewz : camera->Z() + camera->GetCameraHeight() };
		viewsector = camera->Sector;
		r_showviewer = false;
	}
	iview->New.Angles = camera->Angles;
	if (camera->player != 0)
	{
		player = camera->player;
	}

	if (iview->otic == -1 || r_NoInterpolate)
	{
		R_ResetViewInterpolation ();
		iview->otic = nowtic;
	}

	r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	if (cl_capfps || r_NoInterpolate)
	{
		r_TicFracF = 1.;
	}
	R_InterpolateView (player, r_TicFracF, iview);

	R_SetViewAngle ();

	interpolator.DoInterpolations (r_TicFracF);

	// Keep the view within the sector's floor and ceiling
	if (viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		double theZ = viewsector->ceilingplane.ZatPoint(ViewPos) - 4;
		if (ViewPos.Z > theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (viewsector->PortalBlocksMovement(sector_t::floor))
	{
		double theZ = viewsector->floorplane.ZatPoint(ViewPos) + 4;
		if (ViewPos.Z < theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (!paused)
	{
		FQuakeJiggers jiggers;

		memset(&jiggers, 0, sizeof(jiggers));
		if (DEarthquake::StaticGetQuakeIntensities(camera, jiggers) > 0)
		{
			double quakefactor = r_quakeintensity;
			DAngle an;

			if (jiggers.RollIntensity != 0 || jiggers.RollWave != 0)
			{
				ViewRoll += QuakePower(quakefactor, jiggers.RollIntensity, jiggers.RollWave);
			}
			if (jiggers.RelIntensity.X != 0 || jiggers.RelOffset.X != 0)
			{
				an = camera->Angles.Yaw;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.X, jiggers.RelOffset.X);
				ViewPos += an.ToVector(power);
			}
			if (jiggers.RelIntensity.Y != 0 || jiggers.RelOffset.Y != 0)
			{
				an = camera->Angles.Yaw + 90;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.Y, jiggers.RelOffset.Y);
				ViewPos += an.ToVector(power);
			}
			// FIXME: Relative Z is not relative
			if (jiggers.RelIntensity.Z != 0 || jiggers.RelOffset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.RelIntensity.Z, jiggers.RelOffset.Z);
			}
			if (jiggers.Intensity.X != 0 || jiggers.Offset.X != 0)
			{
				ViewPos.X += QuakePower(quakefactor, jiggers.Intensity.X, jiggers.Offset.X);
			}
			if (jiggers.Intensity.Y != 0 || jiggers.Offset.Y != 0)
			{
				ViewPos.Y += QuakePower(quakefactor, jiggers.Intensity.Y, jiggers.Offset.Y);
			}
			if (jiggers.Intensity.Z != 0 || jiggers.Offset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.Intensity.Z, jiggers.Offset.Z);
			}
		}
	}

	extralight = camera->player ? camera->player->extralight : 0;

	// killough 3/20/98, 4/4/98: select colormap based on player status
	// [RH] Can also select a blend
	newblend = 0;

	TArray<lightlist_t> &lightlist = viewsector->e->XFloor.lightlist;
	if (lightlist.Size() > 0)
	{
		for(unsigned int i = 0; i < lightlist.Size(); i++)
		{
			secplane_t *plane;
			int viewside;
			plane = (i < lightlist.Size()-1) ? &lightlist[i+1].plane : &viewsector->floorplane;
			viewside = plane->PointOnSide(ViewPos);
			// Reverse the direction of the test if the plane was downward facing.
			// We want to know if the view is above it, whatever its orientation may be.
			if (plane->fC() < 0)
				viewside = -viewside;
			if (viewside > 0)
			{
				// 3d floor 'fog' is rendered as a blending value
				PalEntry blendv = lightlist[i].blend;

				// If no alpha is set, use 50%
				if (blendv.a==0 && blendv!=0) blendv.a=128;
				newblend = blendv.d;
				break;
			}
		}
	}
	else
	{
		const sector_t *s = viewsector->GetHeightSec();
		if (s != NULL)
		{
			newblend = s->floorplane.PointOnSide(ViewPos) < 0
				? s->bottommap
				: s->ceilingplane.PointOnSide(ViewPos) < 0
				? s->topmap
				: s->midmap;
			if (APART(newblend) == 0 && newblend >= numfakecmaps)
				newblend = 0;
		}
	}

	// [RH] Don't override testblend unless entering a sector with a
	//		blend different from the previous sector's. Same goes with
	//		NormalLight's maps pointer.
	if (R_OldBlend != newblend)
	{
		R_OldBlend = newblend;
		if (APART(newblend))
		{
			BaseBlendR = RPART(newblend);
			BaseBlendG = GPART(newblend);
			BaseBlendB = BPART(newblend);
			BaseBlendA = APART(newblend) / 255.f;
			NormalLight.Maps = realcolormaps;
		}
		else
		{
			NormalLight.Maps = realcolormaps + NUMCOLORMAPS*256*newblend;
			BaseBlendR = BaseBlendG = BaseBlendB = 0;
			BaseBlendA = 0.f;
		}
	}

	Renderer->CopyStackedViewParameters();
	Renderer->SetupFrame(player);

	validcount++;

	if (RenderTarget == screen && r_clearbuffer != 0)
	{
		int color;
		int hom = r_clearbuffer;

		if (hom == 3)
		{
			hom = ((I_FPSTime() / 128) & 1) + 1;
		}
		if (hom == 1)
		{
			color = GPalette.BlackIndex;
		}
		else if (hom == 2)
		{
			color = GPalette.WhiteIndex;
		}
		else if (hom == 4)
		{
			color = (I_FPSTime() / 32) & 255;
		}
		else
		{
			color = pr_hom();
		}
		Renderer->ClearBuffer(color);
	}
}